

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlAttrPtr xmlCopyPropList(xmlNodePtr target,xmlAttrPtr cur)

{
  xmlAttrPtr pxVar1;
  xmlAttrPtr pxVar2;
  xmlAttrPtr cur_00;
  xmlAttrPtr pxVar3;
  
  if ((target == (xmlNodePtr)0x0) || (target->type == XML_ELEMENT_NODE)) {
    cur_00 = (xmlAttrPtr)0x0;
    pxVar3 = (xmlAttrPtr)0x0;
    for (; cur != (xmlAttrPtr)0x0; cur = cur->next) {
      pxVar1 = xmlCopyProp(target,cur);
      if (pxVar1 == (xmlAttrPtr)0x0) {
        xmlFreePropList(cur_00);
        goto LAB_0014b762;
      }
      pxVar2 = pxVar1;
      if (pxVar3 != (xmlAttrPtr)0x0) {
        pxVar3->next = pxVar1;
        pxVar1->prev = pxVar3;
        pxVar2 = cur_00;
      }
      cur_00 = pxVar2;
      pxVar3 = pxVar1;
    }
  }
  else {
LAB_0014b762:
    cur_00 = (xmlAttrPtr)0x0;
  }
  return cur_00;
}

Assistant:

xmlAttrPtr
xmlCopyPropList(xmlNodePtr target, xmlAttrPtr cur) {
    xmlAttrPtr ret = NULL;
    xmlAttrPtr p = NULL,q;

    if ((target != NULL) && (target->type != XML_ELEMENT_NODE))
        return(NULL);
    while (cur != NULL) {
        q = xmlCopyProp(target, cur);
	if (q == NULL) {
            xmlFreePropList(ret);
	    return(NULL);
        }
	if (p == NULL) {
	    ret = p = q;
	} else {
	    p->next = q;
	    q->prev = p;
	    p = q;
	}
	cur = cur->next;
    }
    return(ret);
}